

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,ArrayElementRef *a)

{
  Expression *pEVar1;
  Expression *parent;
  Variable *pVVar2;
  ArrayElement *pAVar3;
  Expression *index;
  CodeLocation *l;
  SliceRange SVar4;
  Type arrayOrVectorType;
  CodeLocation local_68;
  CodeLocation local_58;
  Type local_48;
  
  getArrayOrVectorType(&local_48,this,a);
  pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&a->object);
  parent = evaluateAsExpression(this,pEVar1,&local_48);
  if (a->isSlice == true) {
    SVar4 = AST::ArrayElementRef::getResolvedSliceRange(a);
    if ((this->currentTargetVariable).object == (Variable *)0x0) goto LAB_002649fd;
    pVVar2 = pool_ptr<soul::heart::Variable>::operator*(&this->currentTargetVariable);
    local_58.sourceCode.object =
         (a->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object;
    if (local_58.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_58.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_58.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_58.location.data =
         (a->super_Expression).super_Statement.super_ASTObject.context.location.location.data;
    l = &local_58;
    pAVar3 = BlockBuilder::createFixedArraySlice
                       (&(this->builder).super_BlockBuilder,l,parent,SVar4.start,SVar4.end);
    BlockBuilder::addCastOrAssignment
              (&(this->builder).super_BlockBuilder,&pVVar2->super_Expression,
               &pAVar3->super_Expression);
  }
  else {
    pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&a->startIndex);
    index = evaluateAsExpression(this,pEVar1);
    if ((this->currentTargetVariable).object == (Variable *)0x0) goto LAB_002649fd;
    pVVar2 = pool_ptr<soul::heart::Variable>::operator*(&this->currentTargetVariable);
    local_68.sourceCode.object =
         (a->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object;
    if (local_68.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_68.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_68.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_68.location.data =
         (a->super_Expression).super_Statement.super_ASTObject.context.location.location.data;
    l = &local_68;
    pAVar3 = BlockBuilder::createDynamicSubElement
                       (&(this->builder).super_BlockBuilder,l,parent,index,false,
                        a->suppressWrapWarning);
    BlockBuilder::addCastOrAssignment
              (&(this->builder).super_BlockBuilder,&pVVar2->super_Expression,
               &pAVar3->super_Expression);
  }
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&l->sourceCode);
LAB_002649fd:
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
  return;
}

Assistant:

void visit (AST::ArrayElementRef& a) override
    {
        auto arrayOrVectorType = getArrayOrVectorType (a);
        auto& source = evaluateAsExpression (*a.object, arrayOrVectorType);

        if (a.isSlice)
        {
            auto sliceRange = a.getResolvedSliceRange();

            if (currentTargetVariable != nullptr)
                builder.addCastOrAssignment (*currentTargetVariable,
                                             builder.createFixedArraySlice (a.context.location,
                                                                            source, sliceRange.start, sliceRange.end));
            return;
        }

        auto& index = evaluateAsExpression (*a.startIndex);

        if (currentTargetVariable != nullptr)
            builder.addCastOrAssignment (*currentTargetVariable,
                                         builder.createDynamicSubElement (a.context.location, source, index,
                                                                          false, a.suppressWrapWarning));
    }